

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

void __thiscall testing::internal::RE::Init(RE *this,char *regex)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *__s;
  Message *pMVar4;
  char *message;
  char *in_R9;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_98;
  string local_88;
  AssertHelper local_68;
  Message local_60 [3];
  undefined1 local_48 [8];
  AssertionResult gtest_ar_;
  char *partial_regex;
  char *full_pattern;
  size_t full_regex_len;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Stack_18;
  int reg_flags;
  char *regex_local;
  RE *this_local;
  
  _Stack_18._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)regex;
  regex_local = (char *)this;
  std::__cxx11::string::operator=((string *)this,regex);
  sVar3 = strlen((char *)_Stack_18._M_head_impl);
  __s = (char *)operator_new__(sVar3 + 10);
  snprintf(__s,sVar3 + 10,"^(%s)$",_Stack_18._M_head_impl);
  iVar2 = regcomp((regex_t *)&this->full_regex_,__s,1);
  this->is_valid_ = iVar2 == 0;
  if ((this->is_valid_ & 1U) != 0) {
    if ((_Stack_18._M_head_impl)->_M_dataplus == (_Alloc_hider)0x0) {
      local_98._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)"**circuit.rbegin() == H()" + 0x17);
    }
    else {
      local_98._M_head_impl = _Stack_18._M_head_impl;
    }
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )local_98._M_head_impl;
    iVar2 = regcomp((regex_t *)&this->partial_regex_,(char *)local_98._M_head_impl,1);
    this->is_valid_ = iVar2 == 0;
  }
  AssertionResult::AssertionResult<bool>((AssertionResult *)local_48,&this->is_valid_,(type *)0x0);
  bVar1 = AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    Message::Message(local_60);
    pMVar4 = Message::operator<<(local_60,(char (*) [21])"Regular expression \"");
    pMVar4 = Message::operator<<(pMVar4,(char **)&stack0xffffffffffffffe8);
    pMVar4 = Message::operator<<(pMVar4,(char (*) [52])
                                        "\" is not a valid POSIX Extended regular expression.");
    GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_88,(internal *)local_48,(AssertionResult *)"is_valid_","false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/gtest-src/googletest/src/gtest-port.cc"
               ,0x2e9,message);
    AssertHelper::operator=(&local_68,pMVar4);
    AssertHelper::~AssertHelper(&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    Message::~Message(local_60);
  }
  AssertionResult::~AssertionResult((AssertionResult *)local_48);
  if (__s != (char *)0x0) {
    operator_delete__(__s);
  }
  return;
}

Assistant:

void RE::Init(const char* regex) {
  pattern_ = regex;

  // NetBSD (and Android, which takes its regex implemntation from NetBSD) does
  // not include the GNU regex extensions (such as Perl style character classes
  // like \w) in REG_EXTENDED. REG_EXTENDED is only specified to include the
  // [[:alpha:]] style character classes. Enable REG_GNU wherever it is defined
  // so users can use those extensions.
#if defined(REG_GNU)
  constexpr int reg_flags = REG_EXTENDED | REG_GNU;
#else
  constexpr int reg_flags = REG_EXTENDED;
#endif

  // Reserves enough bytes to hold the regular expression used for a
  // full match.
  const size_t full_regex_len = strlen(regex) + 10;
  char* const full_pattern = new char[full_regex_len];

  snprintf(full_pattern, full_regex_len, "^(%s)$", regex);
  is_valid_ = regcomp(&full_regex_, full_pattern, reg_flags) == 0;
  // We want to call regcomp(&partial_regex_, ...) even if the
  // previous expression returns false.  Otherwise partial_regex_ may
  // not be properly initialized can may cause trouble when it's
  // freed.
  //
  // Some implementation of POSIX regex (e.g. on at least some
  // versions of Cygwin) doesn't accept the empty string as a valid
  // regex.  We change it to an equivalent form "()" to be safe.
  if (is_valid_) {
    const char* const partial_regex = (*regex == '\0') ? "()" : regex;
    is_valid_ = regcomp(&partial_regex_, partial_regex, reg_flags) == 0;
  }
  EXPECT_TRUE(is_valid_)
      << "Regular expression \"" << regex
      << "\" is not a valid POSIX Extended regular expression.";

  delete[] full_pattern;
}